

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * gmlc::utilities::stringOps::xmlCharacterCodeReplace
                   (string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
  sVar1 = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (__return_storage_ptr__,"&gt;",sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar1,4,">");
    sVar1 = sVar1 + 1;
  }
  sVar1 = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (__return_storage_ptr__,"&lt;",sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar1,4,"<");
    sVar1 = sVar1 + 1;
  }
  sVar1 = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (__return_storage_ptr__,"&quot;",sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar1,6,"\"");
    sVar1 = sVar1 + 1;
  }
  sVar1 = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (__return_storage_ptr__,"&apos;",sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar1,6,"\'");
    sVar1 = sVar1 + 1;
  }
  sVar1 = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (__return_storage_ptr__,"&amp;",sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar1,5,"&");
    sVar1 = sVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string xmlCharacterCodeReplace(std::string str)
    {
        std::string out = std::move(str);
        auto codeLoc = out.find("&gt;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 4, ">");
            codeLoc = out.find("&gt;", codeLoc + 1);
        }
        codeLoc = out.find("&lt;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 4, "<");
            codeLoc = out.find("&lt;", codeLoc + 1);
        }
        codeLoc = out.find("&quot;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 6, "\"");
            codeLoc = out.find("&quot;", codeLoc + 1);
        }
        codeLoc = out.find("&apos;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 6, "'");
            codeLoc = out.find("&apos;", codeLoc + 1);
        }
        // &amp; is last so it can't trigger other sequences
        codeLoc = out.find("&amp;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 5, "&");
            codeLoc = out.find("&amp;", codeLoc + 1);
        }
        return out;
    }